

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoration_manager.cpp
# Opt level: O2

void __thiscall
spvtools::opt::analysis::DecorationManager::AddDecorationVal
          (DecorationManager *this,uint32_t inst_id,uint32_t decoration,uint32_t decoration_value)

{
  long lVar1;
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  initializer_list<unsigned_int> init_list_01;
  uint32_t local_15c;
  uint32_t local_158;
  uint32_t local_154;
  SmallVector<unsigned_int,_2UL> local_150;
  SmallVector<unsigned_int,_2UL> local_128;
  SmallVector<unsigned_int,_2UL> local_100;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined1 local_c0 [48];
  undefined4 local_90;
  SmallVector<unsigned_int,_2UL> local_88;
  undefined4 local_60;
  SmallVector<unsigned_int,_2UL> local_58;
  
  init_list._M_len = 1;
  init_list._M_array = &local_154;
  local_154 = inst_id;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_100,init_list);
  local_c0._0_4_ = 1;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector
            ((SmallVector<unsigned_int,_2UL> *)(local_c0 + 8),&local_100);
  init_list_00._M_len = 1;
  init_list_00._M_array = &local_158;
  local_158 = decoration;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_128,init_list_00);
  local_90 = 6;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_88,&local_128);
  init_list_01._M_len = 1;
  init_list_01._M_array = &local_15c;
  local_15c = decoration_value;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_150,init_list_01);
  local_60 = 6;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_58,&local_150);
  local_d8 = 0;
  uStack_d0 = 0;
  local_c8 = 0;
  std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
  _M_range_initialize<spvtools::opt::Operand_const*>
            ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)&local_d8,
             local_c0,&stack0xffffffffffffffd0);
  AddDecoration(this,OpDecorate,
                (vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)&local_d8
               );
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)&local_d8);
  lVar1 = 0x68;
  do {
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector
              ((SmallVector<unsigned_int,_2UL> *)(local_c0 + lVar1));
    lVar1 = lVar1 + -0x30;
  } while (lVar1 != -0x28);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_150);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_128);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_100);
  return;
}

Assistant:

void DecorationManager::AddDecorationVal(uint32_t inst_id, uint32_t decoration,
                                         uint32_t decoration_value) {
  AddDecoration(
      spv::Op::OpDecorate,
      {{spv_operand_type_t::SPV_OPERAND_TYPE_ID, {inst_id}},
       {spv_operand_type_t::SPV_OPERAND_TYPE_LITERAL_INTEGER, {decoration}},
       {spv_operand_type_t::SPV_OPERAND_TYPE_LITERAL_INTEGER,
        {decoration_value}}});
}